

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hand.cpp
# Opt level: O3

void __thiscall Hand::getHigherFinger(Hand *this)

{
  int iVar1;
  pointer pFVar2;
  Point PVar3;
  Finger *f;
  pointer pFVar4;
  int iVar5;
  Finger local_48;
  
  Finger::Finger(&local_48);
  pFVar4 = (this->fingers).super__Vector_base<Finger,_std::allocator<Finger>_>._M_impl.
           super__Vector_impl_data._M_start;
  pFVar2 = (this->fingers).super__Vector_base<Finger,_std::allocator<Finger>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pFVar4 != pFVar2) {
    iVar5 = -1;
    do {
      iVar1 = (pFVar4->ptStart).y;
      if (iVar1 < iVar5 || iVar5 == -1) {
        local_48.ptStart.x = (pFVar4->ptStart).x;
        local_48.ptEnd = pFVar4->ptEnd;
        local_48.ptFar = pFVar4->ptFar;
        local_48.index = pFVar4->index;
        local_48.hndAngle = pFVar4->hndAngle;
        local_48.depth = pFVar4->depth;
        local_48.maxAngle = pFVar4->maxAngle;
        local_48.minDepth = pFVar4->minDepth;
        local_48.ok = pFVar4->ok;
        local_48.shouldCheckAngles = pFVar4->shouldCheckAngles;
        local_48.shouldCheckDist = pFVar4->shouldCheckDist;
        local_48._39_1_ = pFVar4->field_0x27;
        local_48.boundingBox.x = (pFVar4->boundingBox).x;
        local_48.boundingBox.y = (pFVar4->boundingBox).y;
        local_48.boundingBox.width = (pFVar4->boundingBox).width;
        local_48.boundingBox.height = (pFVar4->boundingBox).height;
        iVar5 = iVar1;
        local_48.ptStart.y = iVar1;
      }
      pFVar4 = pFVar4 + 1;
    } while (pFVar4 != pFVar2);
  }
  PVar3.y = local_48.ptStart.y;
  PVar3.x = local_48.ptStart.x;
  (this->higherFinger).ptStart = PVar3;
  (this->higherFinger).ptEnd = local_48.ptEnd;
  (this->higherFinger).ptFar = local_48.ptFar;
  (this->higherFinger).depth = local_48.depth;
  (this->higherFinger).maxAngle = local_48.maxAngle;
  (this->higherFinger).minDepth = local_48.minDepth;
  (this->higherFinger).ok = local_48.ok;
  (this->higherFinger).shouldCheckAngles = local_48.shouldCheckAngles;
  (this->higherFinger).shouldCheckDist = local_48.shouldCheckDist;
  (this->higherFinger).field_0x27 = local_48._39_1_;
  (this->higherFinger).index = local_48.index;
  (this->higherFinger).hndAngle = local_48.hndAngle;
  (this->higherFinger).boundingBox.x = local_48.boundingBox.x;
  (this->higherFinger).boundingBox.y = local_48.boundingBox.y;
  (this->higherFinger).boundingBox.width = local_48.boundingBox.width;
  (this->higherFinger).boundingBox.height = local_48.boundingBox.height;
  return;
}

Assistant:

void Hand::getHigherFinger() {
    int maxY = -1;
    Finger hf;
    for (Finger &f : fingers) {
        if (maxY == -1 || f.ptStart.y < maxY) {
            maxY = f.ptStart.y;
            hf = f;
        }
    }
    higherFinger = hf;
}